

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::ZeroCopyCodedInputStream::Next
          (ZeroCopyCodedInputStream *this,void **data,int *size)

{
  int count;
  CodedInputStream *this_00;
  bool bVar1;
  int original_buffer_size;
  
  bVar1 = io::CodedInputStream::GetDirectBufferPointer(this->cis_,data,size);
  if (bVar1) {
    count = *size;
    if (-1 < (long)count) {
      this_00 = this->cis_;
      original_buffer_size = *(int *)&this_00->buffer_end_ - (int)this_00->buffer_;
      if (original_buffer_size < count) {
        io::CodedInputStream::SkipFallback(this_00,count,original_buffer_size);
      }
      else {
        this_00->buffer_ = this_00->buffer_ + count;
      }
    }
  }
  return bVar1;
}

Assistant:

bool Next(const void** data, int* size) final {
    if (!cis_->GetDirectBufferPointer(data, size)) return false;
    cis_->Skip(*size);
    return true;
  }